

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ADPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ADPlanner *this,
          ADSearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  int iVar1;
  DiscreteSpaceInformation *pDVar2;
  uint *__args;
  pointer piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  runtime_error *prVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  iterator iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  CMDPSTATE *__args_00;
  pointer *ppiVar16;
  uint uVar17;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  CMDPSTATE *local_88;
  void *local_78;
  long lStack_70;
  long local_68;
  void *local_58;
  long lStack_50;
  long local_48;
  pointer *local_38;
  
  local_48 = 0;
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_68 = 0;
  local_78 = (void *)0x0;
  lStack_70 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->bforwardsearch == true) {
    local_88 = pSearchStateSpace->searchgoalstate;
    __args_00 = pSearchStateSpace->searchstartstate;
    iVar5 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x30])(this,pSearchStateSpace);
    if (iVar5 == 1) {
      iVar12._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      if (iVar12._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00135731;
      *iVar12._M_current = __args_00->StateID;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar12._M_current + 1;
      goto LAB_0013573c;
    }
  }
  else {
    __args_00 = pSearchStateSpace->searchgoalstate;
    local_88 = pSearchStateSpace->searchstartstate;
    iVar12._M_current = (int *)0x0;
LAB_00135731:
    local_38 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar12,&__args_00->StateID)
    ;
LAB_0013573c:
    ppiVar16 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *solcost = 0;
    if (_stdout == 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"ERROR: could not open file");
      *(undefined ***)prVar7 = &PTR__runtime_error_00157508;
      __cxa_throw(prVar7,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar13 = (ulong)(uint)__args_00->StateID;
    uVar6 = local_88->StateID;
    if (__args_00->StateID == uVar6) goto LAB_001358a6;
    pvVar11 = __args_00->PlannerSpecificData;
    if (pvVar11 != (void *)0x0) {
      uVar4 = 1;
      uVar17 = 0;
      while ((uVar8 = uVar4, *(long *)((long)pvVar11 + 0x38) != 0 &&
             (*(int *)((long)pvVar11 + 0x24) != 1000000000))) {
        pDVar2 = (this->super_SBPLPlanner).environment_;
        (*pDVar2->_vptr_DiscreteSpaceInformation[5])(pDVar2,uVar13,&local_58,&local_78);
        uVar13 = lStack_50 - (long)local_58 >> 2;
        if ((int)(uint)uVar13 < 1) {
          iVar5 = 1000000000;
        }
        else {
          uVar9 = lStack_70 - (long)local_78 >> 2;
          iVar5 = 1000000000;
          uVar15 = 0;
          do {
            uVar10 = uVar13;
            uVar14 = uVar13;
            if (uVar13 == uVar15) {
LAB_001358ee:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar14,uVar10);
            }
            if (*(int *)((long)local_58 + uVar15 * 4) == **(int **)((long)pvVar11 + 0x38)) {
              uVar10 = uVar9;
              uVar14 = uVar15;
              if (uVar9 <= uVar15) goto LAB_001358ee;
              iVar1 = *(int *)((long)local_78 + uVar15 * 4);
              if (iVar1 < iVar5) {
                iVar5 = iVar1;
              }
            }
            uVar15 = uVar15 + 1;
          } while (((uint)uVar13 & 0x7fffffff) != uVar15);
        }
        *solcost = *solcost + iVar5;
        if (*(uint *)((long)pvVar11 + 0x20) < *(uint *)((long)pvVar11 + 0x24)) {
          (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x31])(this,pvVar11,_stdout);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"ERROR: underconsistent state on the path");
          *(undefined ***)prVar7 = &PTR__runtime_error_00157508;
          __cxa_throw(prVar7,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        __args = *(uint **)((long)pvVar11 + 0x38);
        iVar12._M_current = *ppiVar16;
        if (iVar12._M_current == *local_38) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar12,(int *)__args)
          ;
        }
        else {
          *iVar12._M_current = *__args;
          *ppiVar16 = iVar12._M_current + 1;
        }
        uVar13 = (ulong)*__args;
        uVar6 = local_88->StateID;
        if ((*__args == uVar6) || (0x1869e < uVar17)) break;
        pvVar11 = *(void **)(__args + 0xe);
        uVar4 = uVar8 + 1;
        uVar17 = uVar8;
        if (pvVar11 == (void *)0x0) break;
      }
    }
    if ((uint)uVar13 == uVar6) goto LAB_001358a6;
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      *ppiVar16 = piVar3;
    }
  }
  *solcost = 1000000000;
LAB_001358a6:
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> ADPlanner::GetSearchPath(ADSearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ADState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        if (ReconstructPath(pSearchStateSpace) != 1) {
            solcost = INFINITECOST;
            return wholePathIds;
        }
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

#if DEBUG
    //PrintSearchPath(pSearchStateSpace, fDeb);
#endif

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != goalstate->StateID && steps < max_steps) {
        steps++;

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) actioncost
                = CostV.at(i);

        }
        solcost += actioncost;

        if (searchstateinfo->v < searchstateinfo->g) {
            const char* msg = "ERROR: underconsistent state on the path";
            SBPL_ERROR("%s\n", msg);
            PrintSearchState(searchstateinfo, stdout);
            //SBPL_FPRINTF(fDeb, "ERROR: underconsistent state on the path\n");
            //PrintSearchState(searchstateinfo, fDeb);
            throw SBPL_Exception(msg);
        }

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    if (state->StateID != goalstate->StateID) {
        SBPL_ERROR("ERROR: Failed to getsearchpath, steps processed=%d\n", steps);
        wholePathIds.clear();
        solcost = INFINITECOST;
        return wholePathIds;
    }

    //PrintSearchPath(pSearchStateSpace, stdout);

    return wholePathIds;
}